

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O0

void __thiscall capnp::_::BuilderArena::BuilderArena(BuilderArena *this,MessageBuilder *message)

{
  SegmentId local_28 [4];
  MessageBuilder *local_18;
  MessageBuilder *message_local;
  BuilderArena *this_local;
  
  local_18 = message;
  message_local = (MessageBuilder *)this;
  Arena::Arena(&this->super_Arena);
  (this->super_Arena)._vptr_Arena = (_func_int **)&PTR__BuilderArena_00631be0;
  this->message = local_18;
  ReadLimiter::ReadLimiter(&this->dummyLimiter);
  LocalCapTable::LocalCapTable(&this->localCapTable);
  kj::Id<unsigned_int,_capnp::_::Segment>::Id(local_28,0);
  SegmentBuilder::SegmentBuilder
            (&this->segment0,(BuilderArena *)0x0,local_28[0],(void *)0x0,(ReadLimiter *)0x0);
  kj::ArrayPtr<const_capnp::word>::ArrayPtr(&this->segment0ForOutput);
  kj::Maybe<kj::Own<capnp::_::BuilderArena::MultiSegmentState>_>::Maybe(&this->moreSegments);
  this->segmentWithSpace = (SegmentBuilder *)0x0;
  return;
}

Assistant:

BuilderArena::BuilderArena(MessageBuilder* message)
    : message(message), segment0(nullptr, SegmentId(0), nullptr, nullptr) {}